

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf_v3::load_loddata(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint *puVar4;
  uint16_t *puVar5;
  size_t sVar6;
  ogf3_vsplit *poVar7;
  uint16_t *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  sVar6 = xr_reader::find_chunk(r,1);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xba,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  this->m_min_vertices = *puVar3;
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  this->m_min_indices = *puVar3;
  sVar6 = xr_reader::find_chunk(r,2);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xc0,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  if (((this->super_xr_ogf).m_loaded & 0x80) == 0) {
    __assert_fail("is_chunk_loaded(OGF3_VERTICES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xc1,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  sVar6 = (this->super_xr_ogf).m_vb.super_xr_flexbuf.m_size;
  uVar11 = (ulong)this->m_min_vertices;
  poVar7 = (ogf3_vsplit *)
           operator_new__(-(ulong)(sVar6 - uVar11 >> 0x3e != 0) | (sVar6 - uVar11) * 4);
  this->m_vsplits = poVar7;
  if (sVar6 != uVar11) {
    lVar9 = 0;
    puVar3 = (r->field_2).m_p_u32;
    do {
      *(uint32_t *)((long)&poVar7->vert + lVar9) = *puVar3;
      (r->field_2).m_p_u32 = puVar3 + 1;
      lVar9 = lVar9 + 4;
      puVar3 = puVar3 + 1;
    } while (sVar6 * 4 + uVar11 * -4 != lVar9);
  }
  sVar6 = xr_reader::find_chunk(r,3);
  if (sVar6 != 0) {
    puVar4 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
    uVar2 = *puVar4;
    this->m_num_fix_faces = uVar2;
    uVar11 = (ulong)uVar2 * 2;
    puVar8 = (uint16_t *)operator_new__(uVar11);
    this->m_fix_faces = puVar8;
    if ((ulong)uVar2 != 0) {
      uVar10 = 0;
      puVar5 = (r->field_2).m_p_u16;
      do {
        *(uint16_t *)((long)puVar8 + uVar10) = *puVar5;
        (r->field_2).m_p_u16 = puVar5 + 1;
        uVar10 = uVar10 + 2;
        puVar5 = puVar5 + 1;
      } while (uVar11 != uVar10);
    }
    setup_ib0(this);
    pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 1);
    *pbVar1 = *pbVar1 | 2;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,200,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
}

Assistant:

inline void xr_ogf_v3::load_loddata(xr_reader& r)
{
	if (!r.find_chunk(OGF3_HOPPE_HEADER))
		xr_not_expected();
	m_min_vertices = r.r_u32();
	m_min_indices = r.r_u32();
	r.debug_find_chunk();

	if (!r.find_chunk(OGF3_HOPPE_VERT_SPLITS))
		xr_not_expected();
	xr_assert(is_chunk_loaded(OGF3_VERTICES));
	size_t num_vsplits = m_vb.size() - m_min_vertices;
	m_vsplits = new ogf3_vsplit[num_vsplits];
	r.r_cseq(num_vsplits, m_vsplits);
	r.debug_find_chunk();

	if (!r.find_chunk(OGF3_HOPPE_FIX_FACES))
		xr_not_expected();
	m_num_fix_faces = r.r_u32();
	m_fix_faces = new uint16_t[m_num_fix_faces];
	r.r_cseq(m_num_fix_faces, m_fix_faces);
	r.debug_find_chunk();

	setup_ib0();

	set_chunk_loaded(OGF3_LODDATA);
}